

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_currencysymbols.cpp
# Opt level: O0

void __thiscall
icu_63::number::impl::CurrencySymbols::CurrencySymbols
          (CurrencySymbols *this,CurrencyUnit *currency,Locale *locale,UErrorCode *status)

{
  char *str;
  StringPiece s;
  undefined1 local_38 [12];
  UErrorCode *local_28;
  UErrorCode *status_local;
  Locale *locale_local;
  CurrencyUnit *currency_local;
  CurrencySymbols *this_local;
  
  local_28 = status;
  status_local = (UErrorCode *)locale;
  locale_local = (Locale *)currency;
  currency_local = (CurrencyUnit *)this;
  CurrencyUnit::CurrencyUnit(&this->fCurrency,currency);
  str = Locale::getName((Locale *)status_local);
  StringPiece::StringPiece((StringPiece *)local_38,str);
  s._12_4_ = 0;
  s.ptr_ = (char *)local_38._0_8_;
  s.length_ = local_38._8_4_;
  CharString::CharString(&this->fLocaleName,s,local_28);
  UnicodeString::UnicodeString(&this->fCurrencySymbol);
  UnicodeString::UnicodeString(&this->fIntlCurrencySymbol);
  UnicodeString::setToBogus(&this->fCurrencySymbol);
  UnicodeString::setToBogus(&this->fIntlCurrencySymbol);
  return;
}

Assistant:

CurrencySymbols::CurrencySymbols(CurrencyUnit currency, const Locale& locale, UErrorCode& status)
        : fCurrency(currency), fLocaleName(locale.getName(), status) {
    fCurrencySymbol.setToBogus();
    fIntlCurrencySymbol.setToBogus();
}